

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall SQFuncState::AllocStackPos(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  SQLocalVarInfo *pSVar3;
  ulong uVar4;
  ulong uVar5;
  SQUnsignedInteger SVar6;
  SQObjectPtr local_40;
  SQUnsignedInteger SStack_30;
  SQUnsignedInteger local_28;
  SQUnsignedInteger SStack_20;
  
  uVar2 = (this->_vlocals)._size;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SStack_30 = 0;
  local_28 = 0;
  SStack_20 = 0;
  pSVar3 = (this->_vlocals)._vals;
  uVar4 = (this->_vlocals)._allocated;
  uVar5 = uVar2;
  if (uVar4 <= uVar2) {
    SVar6 = 4;
    if (uVar2 * 2 != 0) {
      SVar6 = uVar2 * 2;
    }
    pSVar3 = (SQLocalVarInfo *)sq_vm_realloc(pSVar3,uVar4 * 0x28,SVar6 * 0x28);
    (this->_vlocals)._vals = pSVar3;
    (this->_vlocals)._allocated = SVar6;
    uVar5 = (this->_vlocals)._size;
  }
  (this->_vlocals)._size = uVar5 + 1;
  pSVar3 = pSVar3 + uVar5;
  (pSVar3->_name).super_SQObject._type = OT_NULL;
  (pSVar3->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (pSVar3->_name).super_SQObject._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
  (pSVar3->_name).super_SQObject._type = local_40.super_SQObject._type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar3->_start_op = SStack_30;
  pSVar3->_end_op = local_28;
  pSVar3->_pos = SStack_20;
  SQObjectPtr::~SQObjectPtr(&local_40);
  uVar4 = (this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar4) {
    if (0xff < this->_stacksize) {
      (*this->_errfunc)(this->_errtarget,"internal compiler error: too many locals");
      uVar4 = (this->_vlocals)._size;
    }
    this->_stacksize = uVar4;
  }
  return uVar2;
}

Assistant:

SQInteger SQFuncState::AllocStackPos()
{
    SQInteger npos=_vlocals.size();
    _vlocals.push_back(SQLocalVarInfo());
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize)) {
        if(_stacksize>MAX_FUNC_STACKSIZE) Error(_SC("internal compiler error: too many locals"));
        _stacksize=_vlocals.size();
    }
    return npos;
}